

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_pixarlog.c
# Opt level: O2

int PixarLogEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  long lVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  uint8_t *puVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ushort *puVar21;
  float *pfVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  ushort *local_98;
  float *local_90;
  
  puVar10 = tif->tif_data;
  uVar18 = *(uint *)(puVar10 + 0x108);
  if (uVar18 - 2 < 3) {
    cc = (ulong)cc >> 1;
  }
  else if (1 < uVar18) {
    if (uVar18 != 5) {
LAB_00269b64:
      TIFFErrorExtR(tif,"PixarLogEncode","%u bit input not supported in PixarLog",
                    (ulong)(tif->tif_dir).td_bitspersample);
      return 0;
    }
    cc = (ulong)cc >> 2;
  }
  iVar25 = (uint)*(ushort *)(puVar10 + 0x100) * (tif->tif_dir).td_imagewidth;
  lVar15 = (long)iVar25;
  if ((long)((ulong)(tif->tif_dir).td_rowsperstrip * lVar15) < cc) {
    pcVar17 = "Too many input bytes provided";
  }
  else {
    local_98 = *(ushort **)(puVar10 + 0xf8);
    lVar12 = lVar15 * 2;
    lVar1 = lVar15 * 4;
    local_90 = (float *)bp;
    for (lVar24 = 0; fVar13 = Fltsize, lVar24 < cc; lVar24 = lVar24 + lVar15) {
      iVar20 = *(int *)(puVar10 + 0x108);
      if (iVar20 == 0) {
        uVar3 = *(ushort *)(puVar10 + 0x100);
        lVar14 = lVar15;
        if ((int)(uint)uVar3 <= iVar25) {
          lVar11 = *(long *)(puVar10 + 0x148);
          uVar18 = (uint)uVar3;
          if (uVar18 == 3) {
            uVar5 = *(ushort *)(lVar11 + (ulong)*(byte *)local_90 * 2);
            *local_98 = uVar5;
            uVar6 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + 1) * 2);
            local_98[1] = uVar6;
            uVar3 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + 2) * 2);
            local_98[2] = uVar3;
            lVar27 = 5;
            for (iVar20 = iVar25; 3 < iVar20; iVar20 = iVar20 + -3) {
              uVar4 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27 + -2) * 2);
              local_98[lVar27 + -2] = uVar4 - uVar5 & 0x7ff;
              uVar5 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27 + -1) * 2);
              local_98[lVar27 + -1] = uVar5 - uVar6 & 0x7ff;
              uVar7 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27) * 2);
              local_98[lVar27] = uVar7 - uVar3 & 0x7ff;
              lVar27 = lVar27 + 3;
              uVar6 = uVar5;
              uVar3 = uVar7;
              uVar5 = uVar4;
            }
          }
          else if (uVar18 == 4) {
            uVar4 = *(ushort *)(lVar11 + (ulong)*(byte *)local_90 * 2);
            *local_98 = uVar4;
            uVar5 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + 1) * 2);
            local_98[1] = uVar5;
            uVar6 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + 2) * 2);
            local_98[2] = uVar6;
            uVar3 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + 3) * 2);
            local_98[3] = uVar3;
            lVar27 = 7;
            for (iVar20 = iVar25; 4 < iVar20; iVar20 = iVar20 + -4) {
              uVar7 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27 + -3) * 2);
              local_98[lVar27 + -3] = uVar7 - uVar4 & 0x7ff;
              uVar4 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27 + -2) * 2);
              local_98[lVar27 + -2] = uVar4 - uVar5 & 0x7ff;
              uVar8 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27 + -1) * 2);
              local_98[lVar27 + -1] = uVar8 - uVar6 & 0x7ff;
              uVar9 = *(ushort *)(lVar11 + (ulong)*(byte *)((long)local_90 + lVar27) * 2);
              local_98[lVar27] = uVar9 - uVar3 & 0x7ff;
              lVar27 = lVar27 + 4;
              uVar5 = uVar4;
              uVar4 = uVar7;
              uVar6 = uVar8;
              uVar3 = uVar9;
            }
          }
          else {
            puVar21 = local_98;
            pfVar22 = local_90;
            uVar23 = uVar3 + 1;
            do {
              *puVar21 = *(ushort *)(lVar11 + (ulong)*(byte *)pfVar22 * 2);
              puVar21 = puVar21 + 1;
              pfVar22 = (float *)((long)pfVar22 + 1);
              uVar23 = uVar23 - 1;
            } while (1 < uVar23);
            iVar20 = iVar25;
            while (iVar26 = iVar20 - (uint)uVar3, uVar23 = uVar3 + 1,
                  iVar26 != 0 && (int)(uint)uVar3 <= iVar20) {
              do {
                *puVar21 = *(short *)(lVar11 + (ulong)*(byte *)pfVar22 * 2) -
                           *(short *)(lVar11 + (ulong)*(byte *)((long)pfVar22 + (long)(int)-uVar18)
                                               * 2) & 0x7ff;
                puVar21 = puVar21 + 1;
                pfVar22 = (float *)((long)pfVar22 + 1);
                uVar23 = uVar23 - 1;
                iVar20 = iVar26;
              } while (1 < (int)uVar23);
            }
          }
        }
      }
      else if (iVar20 == 4) {
        uVar3 = *(ushort *)(puVar10 + 0x100);
        lVar14 = lVar12;
        if ((int)(uint)uVar3 <= iVar25) {
          lVar11 = *(long *)(puVar10 + 0x140);
          uVar18 = (uint)uVar3;
          if (uVar18 == 3) {
            uVar5 = *(ushort *)(lVar11 + (ulong)(*(ushort *)local_90 >> 2) * 2);
            *local_98 = uVar5;
            uVar6 = *(ushort *)(lVar11 + (ulong)(*(ushort *)((long)local_90 + 2) >> 2) * 2);
            local_98[1] = uVar6;
            uVar3 = *(ushort *)(lVar11 + (ulong)(*(ushort *)(local_90 + 1) >> 2) * 2);
            local_98[2] = uVar3;
            lVar27 = 10;
            for (iVar20 = iVar25; 3 < iVar20; iVar20 = iVar20 + -3) {
              uVar4 = *(ushort *)
                       (lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27 + -4) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27 + -4) = uVar4 - uVar5 & 0x7ff;
              uVar5 = *(ushort *)
                       (lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27 + -2) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27 + -2) = uVar5 - uVar6 & 0x7ff;
              uVar7 = *(ushort *)(lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27) = uVar7 - uVar3 & 0x7ff;
              lVar27 = lVar27 + 6;
              uVar6 = uVar5;
              uVar3 = uVar7;
              uVar5 = uVar4;
            }
          }
          else if (uVar18 == 4) {
            uVar4 = *(ushort *)(lVar11 + (ulong)(*(ushort *)local_90 >> 2) * 2);
            *local_98 = uVar4;
            uVar5 = *(ushort *)(lVar11 + (ulong)(*(ushort *)((long)local_90 + 2) >> 2) * 2);
            local_98[1] = uVar5;
            uVar6 = *(ushort *)(lVar11 + (ulong)(*(ushort *)(local_90 + 1) >> 2) * 2);
            local_98[2] = uVar6;
            uVar3 = *(ushort *)(lVar11 + (ulong)(*(ushort *)((long)local_90 + 6) >> 2) * 2);
            local_98[3] = uVar3;
            lVar27 = 0xe;
            for (iVar20 = iVar25; 4 < iVar20; iVar20 = iVar20 + -4) {
              uVar7 = *(ushort *)
                       (lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27 + -6) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27 + -6) = uVar7 - uVar4 & 0x7ff;
              uVar4 = *(ushort *)
                       (lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27 + -4) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27 + -4) = uVar4 - uVar5 & 0x7ff;
              uVar8 = *(ushort *)
                       (lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27 + -2) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27 + -2) = uVar8 - uVar6 & 0x7ff;
              uVar9 = *(ushort *)(lVar11 + (ulong)(*(ushort *)((long)local_90 + lVar27) >> 2) * 2);
              *(ushort *)((long)local_98 + lVar27) = uVar9 - uVar3 & 0x7ff;
              lVar27 = lVar27 + 8;
              uVar5 = uVar4;
              uVar4 = uVar7;
              uVar6 = uVar8;
              uVar3 = uVar9;
            }
          }
          else {
            puVar21 = local_98;
            pfVar22 = local_90;
            uVar23 = uVar3 + 1;
            do {
              *puVar21 = *(ushort *)(lVar11 + (ulong)(*(ushort *)pfVar22 >> 2) * 2);
              puVar21 = puVar21 + 1;
              pfVar22 = (float *)((long)pfVar22 + 2);
              uVar23 = uVar23 - 1;
            } while (1 < uVar23);
            iVar20 = iVar25;
            while (iVar26 = iVar20 - uVar18, uVar23 = uVar3 + 1,
                  iVar26 != 0 && (int)uVar18 <= iVar20) {
              do {
                *puVar21 = *(short *)(lVar11 + (ulong)(*(ushort *)pfVar22 >> 2) * 2) -
                           *(short *)(lVar11 + (ulong)(*(ushort *)
                                                        ((long)pfVar22 -
                                                        (ulong)((uint)uVar3 + (uint)uVar3)) >> 2) *
                                               2) & 0x7ff;
                puVar21 = puVar21 + 1;
                pfVar22 = (float *)((long)pfVar22 + 2);
                uVar23 = uVar23 - 1;
                iVar20 = iVar26;
              } while (1 < (int)uVar23);
            }
          }
        }
      }
      else {
        if (iVar20 != 5) goto LAB_00269b64;
        uVar3 = *(ushort *)(puVar10 + 0x100);
        lVar14 = lVar1;
        if ((int)(uint)uVar3 <= iVar25) {
          lVar11 = *(long *)(puVar10 + 0x138);
          if (uVar3 == 3) {
            fVar2 = *local_90;
            dVar28 = 0.0;
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar28 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar28 = (double)LogK1;
                  dVar31 = log((double)(fVar2 * LogK2));
                  dVar28 = dVar31 * dVar28 + 0.5;
                }
              }
              else {
                dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * Fltsize) * 2);
              }
            }
            dVar31 = 0.0;
            *local_98 = (ushort)(int)dVar28;
            fVar2 = local_90[1];
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar31 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar29 = (double)LogK1;
                  dVar31 = log((double)(fVar2 * LogK2));
                  dVar31 = dVar31 * dVar29 + 0.5;
                }
              }
              else {
                dVar31 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
              }
            }
            local_98[1] = (ushort)(int)dVar31;
            fVar2 = local_90[2];
            dVar29 = 0.0;
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar29 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar29 = (double)LogK1;
                  dVar32 = log((double)(fVar2 * LogK2));
                  dVar29 = dVar32 * dVar29 + 0.5;
                }
              }
              else {
                dVar29 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
              }
            }
            local_98[2] = (ushort)(int)dVar29;
            lVar27 = 10;
            uVar18 = (int)dVar28 & 0xffff;
            uVar23 = (int)dVar31 & 0xffff;
            uVar19 = (int)dVar29 & 0xffff;
            for (iVar20 = iVar25; 3 < iVar20; iVar20 = iVar20 + -3) {
              fVar2 = *(float *)((long)local_90 + lVar27 * 2 + -8);
              dVar28 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar28 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar28 = (double)LogK1;
                    dVar31 = log((double)(fVar2 * LogK2));
                    dVar28 = dVar31 * dVar28 + 0.5;
                  }
                }
                else {
                  dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              dVar31 = 0.0;
              *(ushort *)((long)local_98 + lVar27 + -4) = (short)(int)dVar28 - (short)uVar18 & 0x7ff
              ;
              fVar2 = *(float *)((long)local_90 + lVar27 * 2 + -4);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar31 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar29 = (double)LogK1;
                    dVar31 = log((double)(fVar2 * LogK2));
                    dVar31 = dVar31 * dVar29 + 0.5;
                  }
                }
                else {
                  dVar31 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              *(ushort *)((long)local_98 + lVar27 + -2) = (short)(int)dVar31 - (short)uVar23 & 0x7ff
              ;
              fVar2 = *(float *)((long)local_90 + lVar27 * 2);
              dVar29 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar29 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar29 = (double)LogK1;
                    dVar32 = log((double)(fVar2 * LogK2));
                    dVar29 = dVar32 * dVar29 + 0.5;
                  }
                }
                else {
                  dVar29 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              *(ushort *)((long)local_98 + lVar27) = (short)(int)dVar29 - (short)uVar19 & 0x7ff;
              lVar27 = lVar27 + 6;
              uVar18 = (int)dVar28;
              uVar23 = (int)dVar31;
              uVar19 = (int)dVar29;
            }
          }
          else if (uVar3 == 4) {
            fVar2 = *local_90;
            dVar28 = 0.0;
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar28 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar28 = (double)LogK1;
                  dVar31 = log((double)(fVar2 * LogK2));
                  dVar28 = dVar31 * dVar28 + 0.5;
                }
              }
              else {
                dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * Fltsize) * 2);
              }
            }
            dVar31 = 0.0;
            *local_98 = (ushort)(int)dVar28;
            fVar2 = local_90[1];
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar31 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar29 = (double)LogK1;
                  dVar31 = log((double)(fVar2 * LogK2));
                  dVar31 = dVar31 * dVar29 + 0.5;
                }
              }
              else {
                dVar31 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
              }
            }
            local_98[1] = (ushort)(int)dVar31;
            fVar2 = local_90[2];
            dVar29 = 0.0;
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar29 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar29 = (double)LogK1;
                  dVar32 = log((double)(fVar2 * LogK2));
                  dVar29 = dVar32 * dVar29 + 0.5;
                }
              }
              else {
                dVar29 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
              }
            }
            dVar32 = 0.0;
            local_98[2] = (ushort)(int)dVar29;
            fVar2 = local_90[3];
            if (0.0 <= fVar2) {
              if (2.0 <= fVar2) {
                dVar32 = 2047.0;
                if (fVar2 <= 24.2) {
                  dVar30 = (double)LogK1;
                  dVar32 = log((double)(fVar2 * LogK2));
                  dVar32 = dVar32 * dVar30 + 0.5;
                }
              }
              else {
                dVar32 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
              }
            }
            local_98[3] = (ushort)(int)dVar32;
            lVar27 = 0xe;
            uVar18 = (int)dVar28 & 0xffff;
            uVar23 = (int)dVar31 & 0xffff;
            uVar19 = (int)dVar29 & 0xffff;
            uVar16 = (int)dVar32 & 0xffff;
            for (iVar20 = iVar25; 4 < iVar20; iVar20 = iVar20 + -4) {
              fVar2 = *(float *)((long)local_90 + lVar27 * 2 + -0xc);
              dVar28 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar28 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar28 = (double)LogK1;
                    dVar31 = log((double)(fVar2 * LogK2));
                    dVar28 = dVar31 * dVar28 + 0.5;
                  }
                }
                else {
                  dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              dVar31 = 0.0;
              *(ushort *)((long)local_98 + lVar27 + -6) = (short)(int)dVar28 - (short)uVar18 & 0x7ff
              ;
              fVar2 = *(float *)((long)local_90 + lVar27 * 2 + -8);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar31 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar29 = (double)LogK1;
                    dVar31 = log((double)(fVar2 * LogK2));
                    dVar31 = dVar31 * dVar29 + 0.5;
                  }
                }
                else {
                  dVar31 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              *(ushort *)((long)local_98 + lVar27 + -4) = (short)(int)dVar31 - (short)uVar23 & 0x7ff
              ;
              fVar2 = *(float *)((long)local_90 + lVar27 * 2 + -4);
              dVar29 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar29 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar29 = (double)LogK1;
                    dVar32 = log((double)(fVar2 * LogK2));
                    dVar29 = dVar32 * dVar29 + 0.5;
                  }
                }
                else {
                  dVar29 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              dVar32 = 0.0;
              *(ushort *)((long)local_98 + lVar27 + -2) = (short)(int)dVar29 - (short)uVar19 & 0x7ff
              ;
              fVar2 = *(float *)((long)local_90 + lVar27 * 2);
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar32 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar30 = (double)LogK1;
                    dVar32 = log((double)(fVar2 * LogK2));
                    dVar32 = dVar32 * dVar30 + 0.5;
                  }
                }
                else {
                  dVar32 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              *(ushort *)((long)local_98 + lVar27) = (short)(int)dVar32 - (short)uVar16 & 0x7ff;
              lVar27 = lVar27 + 8;
              uVar18 = (int)dVar28;
              uVar23 = (int)dVar31;
              uVar19 = (int)dVar29;
              uVar16 = (int)dVar32;
            }
          }
          else {
            puVar21 = local_98;
            pfVar22 = local_90;
            uVar18 = uVar3 + 1;
            do {
              fVar2 = *pfVar22;
              dVar28 = 0.0;
              if (0.0 <= fVar2) {
                if (2.0 <= fVar2) {
                  dVar28 = 2047.0;
                  if (fVar2 <= 24.2) {
                    dVar28 = (double)LogK1;
                    dVar31 = log((double)(fVar2 * LogK2));
                    dVar28 = dVar31 * dVar28 + 0.5;
                  }
                }
                else {
                  dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                }
              }
              *puVar21 = (ushort)(int)dVar28;
              puVar21 = puVar21 + 1;
              pfVar22 = pfVar22 + 1;
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
            iVar20 = iVar25;
            while (iVar26 = iVar20 - (uint)uVar3, uVar18 = uVar3 + 1,
                  iVar26 != 0 && (int)(uint)uVar3 <= iVar20) {
              do {
                fVar2 = *pfVar22;
                dVar28 = 0.0;
                if (0.0 <= fVar2) {
                  if (2.0 <= fVar2) {
                    dVar28 = 2047.0;
                    if (fVar2 <= 24.2) {
                      dVar31 = (double)LogK1;
                      dVar28 = log((double)(fVar2 * LogK2));
                      dVar28 = dVar28 * dVar31 + 0.5;
                    }
                  }
                  else {
                    dVar28 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                  }
                }
                dVar31 = 0.0;
                fVar2 = *(float *)((long)pfVar22 - (ulong)((uint)uVar3 * 4));
                if (0.0 <= fVar2) {
                  if (2.0 <= fVar2) {
                    dVar31 = 2047.0;
                    if (fVar2 <= 24.2) {
                      dVar29 = (double)LogK1;
                      dVar31 = log((double)(fVar2 * LogK2));
                      dVar31 = dVar31 * dVar29 + 0.5;
                    }
                  }
                  else {
                    dVar31 = (double)*(ushort *)(lVar11 + (long)(int)(fVar2 * fVar13) * 2);
                  }
                }
                *puVar21 = (short)(int)dVar28 - (short)(int)dVar31 & 0x7ff;
                puVar21 = puVar21 + 1;
                pfVar22 = pfVar22 + 1;
                uVar18 = uVar18 - 1;
                iVar20 = iVar26;
              } while (1 < (int)uVar18);
            }
          }
        }
      }
      local_90 = (float *)((long)local_90 + lVar14);
      local_98 = local_98 + lVar15;
    }
    *(undefined8 *)(puVar10 + 0x80) = *(undefined8 *)(puVar10 + 0xf8);
    *(int *)(puVar10 + 0x88) = (int)cc * 2;
    if (-1 < (int)cc) {
      do {
        iVar25 = deflate((z_streamp)(puVar10 + 0x80),0);
        if (iVar25 != 0) {
          pcVar17 = "(null)";
          if (*(char **)(puVar10 + 0xb0) != (char *)0x0) {
            pcVar17 = *(char **)(puVar10 + 0xb0);
          }
          TIFFErrorExtR(tif,"PixarLogEncode","Encoder error: %s",pcVar17);
          return 0;
        }
        if (*(int *)(puVar10 + 0xa0) == 0) {
          tif->tif_rawcc = tif->tif_rawdatasize;
          iVar25 = TIFFFlushData1(tif);
          if (iVar25 == 0) {
            return 0;
          }
          *(uint8_t **)(puVar10 + 0x98) = tif->tif_rawdata;
          *(int *)(puVar10 + 0xa0) = (int)tif->tif_rawdatasize;
        }
      } while (*(int *)(puVar10 + 0x88) != 0);
      return 1;
    }
    pcVar17 = "ZLib cannot deal with buffers this size";
  }
  TIFFErrorExtR(tif,"PixarLogEncode",pcVar17);
  return 0;
}

Assistant:

static int PixarLogEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "PixarLogEncode";
    TIFFDirectory *td = &tif->tif_dir;
    PixarLogState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t n;
    int llen;
    unsigned short *up;

    (void)s;

    switch (sp->user_datafmt)
    {
        case PIXARLOGDATAFMT_FLOAT:
            n = cc / sizeof(float); /* XXX float == 32 bits */
            break;
        case PIXARLOGDATAFMT_16BIT:
        case PIXARLOGDATAFMT_12BITPICIO:
        case PIXARLOGDATAFMT_11BITLOG:
            n = cc / sizeof(uint16_t); /* XXX uint16_t == 16 bits */
            break;
        case PIXARLOGDATAFMT_8BIT:
        case PIXARLOGDATAFMT_8BITABGR:
            n = cc;
            break;
        default:
            TIFFErrorExtR(tif, module,
                          "%" PRIu16 " bit input not supported in PixarLog",
                          td->td_bitspersample);
            return 0;
    }

    llen = sp->stride * td->td_imagewidth;
    /* Check against the number of elements (of size uint16_t) of sp->tbuf */
    if (n > ((tmsize_t)td->td_rowsperstrip * llen))
    {
        TIFFErrorExtR(tif, module, "Too many input bytes provided");
        return 0;
    }

    for (i = 0, up = sp->tbuf; i < n; i += llen, up += llen)
    {
        switch (sp->user_datafmt)
        {
            case PIXARLOGDATAFMT_FLOAT:
                horizontalDifferenceF((float *)bp, llen, sp->stride, up,
                                      sp->FromLT2);
                bp += llen * sizeof(float);
                break;
            case PIXARLOGDATAFMT_16BIT:
                horizontalDifference16((uint16_t *)bp, llen, sp->stride, up,
                                       sp->From14);
                bp += llen * sizeof(uint16_t);
                break;
            case PIXARLOGDATAFMT_8BIT:
                horizontalDifference8((unsigned char *)bp, llen, sp->stride, up,
                                      sp->From8);
                bp += llen * sizeof(unsigned char);
                break;
            default:
                TIFFErrorExtR(tif, module,
                              "%" PRIu16 " bit input not supported in PixarLog",
                              td->td_bitspersample);
                return 0;
        }
    }

    sp->stream.next_in = (unsigned char *)sp->tbuf;
    assert(sizeof(sp->stream.avail_in) == 4); /* if this assert gets raised,
         we need to simplify this code to reflect a ZLib that is likely updated
         to deal with 8byte memory sizes, though this code will respond
         appropriately even before we simplify it */
    sp->stream.avail_in = (uInt)(n * sizeof(uint16_t));
    if ((sp->stream.avail_in / sizeof(uint16_t)) != (uInt)n)
    {
        TIFFErrorExtR(tif, module, "ZLib cannot deal with buffers this size");
        return (0);
    }

    do
    {
        if (deflate(&sp->stream, Z_NO_FLUSH) != Z_OK)
        {
            TIFFErrorExtR(tif, module, "Encoder error: %s",
                          sp->stream.msg ? sp->stream.msg : "(null)");
            return (0);
        }
        if (sp->stream.avail_out == 0)
        {
            tif->tif_rawcc = tif->tif_rawdatasize;
            if (!TIFFFlushData1(tif))
                return 0;
            sp->stream.next_out = tif->tif_rawdata;
            sp->stream.avail_out =
                (uInt)tif
                    ->tif_rawdatasize; /* this is a safe typecast, as check is
                                          made already in PixarLogPreEncode */
        }
    } while (sp->stream.avail_in > 0);
    return (1);
}